

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsInterface.cpp
# Opt level: O3

shared_ptr<helics::CommFactory::CommBuilder> * __thiscall
helics::CommFactory::MasterCommBuilder::getBuilder(MasterCommBuilder *this,string_view type)

{
  element_type *peVar1;
  pointer ptVar2;
  int iVar3;
  shared_ptr<helics::CommFactory::MasterCommBuilder> *psVar4;
  HelicsException *this_00;
  size_type __rlen;
  tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::CommFactory::CommBuilder>_>
  *builder;
  pointer ptVar5;
  string_view message;
  
  psVar4 = instance();
  peVar1 = (psVar4->
           super___shared_ptr<helics::CommFactory::MasterCommBuilder,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  ptVar5 = (peVar1->builders).
           super__Vector_base<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::CommFactory::CommBuilder>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::CommFactory::CommBuilder>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ptVar2 = (peVar1->builders).
           super__Vector_base<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::CommFactory::CommBuilder>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::CommFactory::CommBuilder>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ptVar5 == ptVar2) {
      this_00 = (HelicsException *)__cxa_allocate_exception(0x28);
      message._M_str = "comm type is not available";
      message._M_len = 0x1a;
      HelicsException::HelicsException(this_00,message);
      __cxa_throw(this_00,&HelicsException::typeinfo,HelicsException::~HelicsException);
    }
    if ((MasterCommBuilder *)
        (ptVar5->
        super__Tuple_impl<0UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::CommFactory::CommBuilder>_>
        ).
        super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::CommFactory::CommBuilder>_>
        .
        super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
        ._M_head_impl._M_string_length == this) {
      if (this == (MasterCommBuilder *)0x0) {
        return (shared_ptr<helics::CommFactory::CommBuilder> *)ptVar5;
      }
      iVar3 = bcmp((void *)type._M_len,
                   (ptVar5->
                   super__Tuple_impl<0UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::CommFactory::CommBuilder>_>
                   ).
                   super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::CommFactory::CommBuilder>_>
                   .
                   super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                   ._M_head_impl._M_dataplus._M_p,(size_t)this);
      if (iVar3 == 0) {
        return (shared_ptr<helics::CommFactory::CommBuilder> *)ptVar5;
      }
    }
    ptVar5 = ptVar5 + 1;
  } while( true );
}

Assistant:

static const std::shared_ptr<CommBuilder>& getBuilder(std::string_view type)
        {
            for (auto& builder : instance()->builders) {
                if (std::get<1>(builder) == type) {
                    return std::get<2>(builder);
                }
            }
            throw(HelicsException("comm type is not available"));
        }